

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionTest_OnePolicyWithCustomQualifier_Test::
TestBody(ParseCertificatePoliciesExtensionTest_OnePolicyWithCustomQualifier_Test *this)

{
  pointer rhs;
  undefined1 auVar1 [8];
  bool bVar2;
  CertErrors *in_R8;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  Input extension_value;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> policies;
  uint8_t kExpectedQualifier [4];
  CertErrors errors;
  uint8_t kExpectedQualifierOid [3];
  string der;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [8];
  pointer pPStack_80;
  pointer local_78;
  AssertHelper local_68;
  CertErrors local_60;
  undefined2 local_44;
  undefined1 uStack_42;
  string sStack_40;
  
  sStack_40._M_string_length = 0;
  sStack_40.field_2._M_local_buf[0] = '\0';
  local_a8 = (undefined1  [8])&local_98;
  sStack_40._M_dataplus._M_p = (pointer)&sStack_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"policy_1_2_3_with_custom_qualifier.pem","");
  LoadTestData((anon_unknown_0 *)local_88,(string *)local_a8,&sStack_40);
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
  }
  if (local_88[0] == (anon_unknown_0)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_88,
               (AssertionResult *)"LoadTestData(\"policy_1_2_3_with_custom_qualifier.pem\", &der)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0xf6,(char *)local_a8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_60.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_60.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pPStack_80 != (pointer)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pPStack_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPStack_80);
    }
    goto LAB_00219fff;
  }
  if (pPStack_80 != (pointer)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pPStack_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPStack_80);
  }
  local_88 = (undefined1  [8])0x0;
  pPStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  CertErrors::CertErrors(&local_60);
  extension_value.data_.size_ = (size_t)local_88;
  extension_value.data_.data_ = (uchar *)sStack_40._M_string_length;
  bVar2 = ParseCertificatePoliciesExtension
                    ((bssl *)sStack_40._M_dataplus._M_p,extension_value,
                     (vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> *)
                     &local_60,in_R8);
  local_b8[0] = bVar2;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_b8,
               (AssertionResult *)
               "ParseCertificatePoliciesExtension(StringAsBytes(der), &policies, &errors)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0xfa,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c0.data_._0_4_ = 1;
  local_b8 = (undefined1  [8])(((long)pPStack_80 - (long)local_88 >> 3) * -0x3333333333333333);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"1U","policies.size()",(uint *)&local_c0,(unsigned_long *)local_b8
            );
  if (local_a8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0xfb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
LAB_00219fbd:
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8 != (undefined1  [8])0x0) {
      (*(code *)(*(AssertHelperData **)local_b8)->file)();
    }
  }
  else {
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    auVar1 = local_88;
    local_b8 = (undefined1  [8])&(anonymous_namespace)::policy_1_2_3_der;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)local_a8,"der::Input(policy_1_2_3_der)","policy.policy_oid",
               (Input *)local_b8,(Input *)local_88);
    if (local_a8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0xfd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    local_c0.data_._0_4_ = 1;
    local_b8 = (undefined1  [8])
               ((long)(((vector<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                         *)((long)auVar1 + 0x10))->
                      super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(((vector<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                         *)((long)auVar1 + 0x10))->
                      super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a8,"1U","policy.policy_qualifiers.size()",(uint *)&local_c0,
               (unsigned_long *)local_b8);
    if (local_a8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0xff,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      goto LAB_00219fbd;
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    rhs = (((vector<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_> *)
           ((long)auVar1 + 0x10))->
          super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>)
          ._M_impl.super__Vector_impl_data._M_start;
    local_b8 = (undefined1  [8])&local_44;
    uStack_42 = 4;
    local_44 = 0x32a;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)local_a8,"der::Input(kExpectedQualifierOid)","qualifier.qualifier_oid",
               (Input *)local_b8,&rhs->qualifier_oid);
    if (local_a8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x103,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    local_b8 = (undefined1  [8])&local_68;
    local_68.data_._0_4_ = 0x6968020c;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)local_a8,"der::Input(kExpectedQualifier)","qualifier.qualifier",
               (Input *)local_b8,&rhs->qualifier);
    if (local_a8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x106,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      goto LAB_00219fbd;
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  CertErrors::~CertErrors(&local_60);
  ::std::vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>::~vector
            ((vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> *)local_88);
LAB_00219fff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40._M_dataplus._M_p != &sStack_40.field_2) {
    operator_delete(sStack_40._M_dataplus._M_p,
                    CONCAT71(sStack_40.field_2._M_allocated_capacity._1_7_,
                             sStack_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}